

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::
str<capnproto_test::capnp::test::TestGenerics<capnp::Text,capnp::List<unsigned_int,(capnp::Kind)0>>::Inner::Builder&>
          (String *__return_storage_ptr__,kj *this,Builder *params)

{
  StringTree *params_00;
  StringTree SStack_48;
  
  capnproto_test::capnp::test::TestGenerics<capnp::Text,_capnp::List<unsigned_int,_(capnp::Kind)0>_>
  ::Inner::Builder::toString(&SStack_48,(Builder *)this);
  _::concat<kj::StringTree>(__return_storage_ptr__,(_ *)&SStack_48,params_00);
  StringTree::~StringTree(&SStack_48);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}